

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::ServiceDescriptorProto::_InternalParse
          (ServiceDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint uVar2;
  Arena *p;
  ParseContext *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff98;
  ParseContext *in_stack_ffffffffffffffa0;
  ParseContext *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  HasBits<1UL> local_2c;
  ParseContext *local_28;
  char *local_20;
  HasBits<1UL> *local_10;
  HasBits<1UL> *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
  p = GetArenaNoVirtual((ServiceDescriptorProto *)in_stack_ffffffffffffffa0);
LAB_005022f1:
  do {
    bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0050252d;
    local_20 = internal::ReadTag((char *)p,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (uint32)((ulong)in_RDI >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_0050254a;
    uVar2 = in_stack_ffffffffffffffc4 >> 3;
    if (uVar2 == 1) {
      if ((in_stack_ffffffffffffffc4 & 0xff) != 10) goto LAB_005024cf;
      _internal_mutable_name_abi_cxx11_
                ((ServiceDescriptorProto *)CONCAT44(1,in_stack_ffffffffffffffb0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI,(ParseContext *)CONCAT44(uVar2,in_stack_ffffffffffffffb0)
                            ,(char *)in_stack_ffffffffffffffa8);
    }
    else {
      if (uVar2 == 2) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x12) {
          local_20 = local_20 + -1;
          uVar3 = 2;
          do {
            local_20 = local_20 + 1;
            in_stack_ffffffffffffffa8 = local_28;
            _internal_add_method((ServiceDescriptorProto *)0x502411);
            local_20 = internal::ParseContext::ParseMessage<google::protobuf::MethodDescriptorProto>
                                 (in_RDI,(MethodDescriptorProto *)
                                         CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                                  (char *)in_stack_ffffffffffffffa8);
            if (local_20 == (char *)0x0) goto LAB_0050254a;
            bVar1 = internal::EpsCopyInputStream::DataAvailable
                              (&local_28->super_EpsCopyInputStream,local_20);
          } while ((bVar1) && (bVar1 = internal::ExpectTag<18u>(local_20), bVar1));
          goto LAB_005022f1;
        }
      }
      else if ((uVar2 == 3) && ((in_stack_ffffffffffffffc4 & 0xff) == 0x1a)) {
        in_stack_ffffffffffffffa0 = local_28;
        _internal_mutable_options((ServiceDescriptorProto *)local_28);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::ServiceOptions>
                             (in_RDI,(ServiceOptions *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                              (char *)in_stack_ffffffffffffffa8);
        goto joined_r0x005024bb;
      }
LAB_005024cf:
      if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&local_28->super_EpsCopyInputStream,in_stack_ffffffffffffffc4);
        goto LAB_0050252d;
      }
      local_20 = internal::UnknownFieldParse
                           (in_stack_ffffffffffffffc4,(InternalMetadataWithArena *)in_RDI,
                            (char *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
    }
joined_r0x005024bb:
    if (local_20 == (char *)0x0) {
LAB_0050254a:
      local_20 = (char *)0x0;
LAB_0050252d:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* ServiceDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.ServiceDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_method(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ServiceOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}